

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O3

string * __thiscall
cmFileAPI::ObjectName_abi_cxx11_(string *__return_storage_ptr__,cmFileAPI *this,Object *o)

{
  char *__s;
  cmAlphaNum *pcVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  undefined1 local_a0 [56];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_68;
  undefined8 local_50;
  char *local_48;
  undefined8 local_40;
  size_t local_38;
  string *local_30;
  cmAlphaNum *local_28;
  
  __s = ObjectKindName::objectKindNames[*(int *)&this->CMakeInstance];
  local_68.first._M_len = strlen(__s);
  local_68.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_50 = 2;
  local_48 = "-v";
  local_40 = 0;
  local_68.first._M_str = __s;
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_a0,(unsigned_long)(this->APIv1)._M_dataplus._M_p);
  pcVar1 = (cmAlphaNum *)(local_a0 + 0x10);
  if ((cmAlphaNum *)local_a0._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_a0._0_8_;
  }
  local_30 = pcVar1->RValueString_;
  pcVar1 = (cmAlphaNum *)local_a0;
  if ((cmAlphaNum *)local_a0._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_a0._0_8_;
  }
  local_38 = (pcVar1->View_)._M_len;
  local_28 = (cmAlphaNum *)local_a0._0_8_;
  views._M_len = 3;
  views._M_array = &local_68;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFileAPI::ObjectName(Object const& o)
{
  std::string name = cmStrCat(ObjectKindName(o.Kind), "-v", o.Version);
  return name;
}